

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void string_contains_stl_string(void)

{
  Constraint *constraint;
  allocator local_31;
  string obbo;
  
  std::__cxx11::string::string((string *)&obbo,"obbo",&local_31);
  constraint = (Constraint *)cgreen::create_contains_string_constraint((string *)&obbo,"obbo");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x4d,"\"bobbob\"","bobbob",constraint);
  std::__cxx11::string::~string((string *)&obbo);
  return;
}

Assistant:

Ensure(string_contains_stl_string) {
    std::string obbo("obbo");
    assert_that("bobbob", contains_string(obbo));
}